

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_geometry_device.cpp
# Opt level: O2

void embree::instanceOccludedFuncN(RTCOccludedFunctionNArguments *args)

{
  LazyGeometry *instance;
  RTCRayN *pRVar1;
  RTCOccludedArguments sargs;
  
  if (*args->valid != 0) {
    instance = (LazyGeometry *)args->geometryUserPtr;
    pRVar1 = args->ray;
    if (instance->state != LAZY_VALID) {
      lazyCreate(instance);
    }
    rtcOccluded1(instance->object,pRVar1);
  }
  return;
}

Assistant:

void instanceOccludedFuncN(const RTCOccludedFunctionNArguments* args)
{
  const int* valid = args->valid;
  void* ptr  = args->geometryUserPtr;
  RTCRayQueryContext* context = args->context;
  RTCRayHitN* rays = (RTCRayHitN*)args->ray;
  assert(args->N == 1);
  LazyGeometry* instance = (LazyGeometry*)ptr;

  if (!valid[0])
    return;
  
  Ray *ray = (Ray *)rays;
  /* create the object if it is not yet created */
  if (instance->state != LAZY_VALID)
    lazyCreate(instance);
  
  /* trace ray inside object */
  RTCOccludedArguments sargs;
  rtcInitOccludedArguments(&sargs);
  sargs.context = context;
  rtcOccluded1(instance->object,RTCRay_(*ray),&sargs);
}